

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

pboolean p_socket_bind(PSocket *socket,PSocketAddress *address,pboolean allow_reuse,PError **error)

{
  pboolean pVar1;
  int iVar2;
  pint pVar3;
  PErrorIO code;
  psize pVar4;
  char *message;
  pint value;
  sockaddr_storage addr;
  
  if ((socket == (PSocket *)0x0) || (address == (PSocketAddress *)0x0)) {
    message = "Invalid input argument";
    pVar3 = 0x1fb;
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      return 0;
    }
    value = (pint)(allow_reuse != 0);
    iVar2 = setsockopt(socket->fd,1,2,&value,4);
    if (iVar2 < 0) {
      printf("** Warning: %s **\n","PSocket::p_socket_bind: setsockopt() with SO_REUSEADDR failed");
    }
    value = 0;
    if (allow_reuse != 0) {
      value = (pint)(socket->type == P_SOCKET_TYPE_DATAGRAM);
    }
    iVar2 = setsockopt(socket->fd,1,0xf,&value,4);
    if (iVar2 < 0) {
      printf("** Warning: %s **\n","PSocket::p_socket_bind: setsockopt() with SO_REUSEPORT failed");
    }
    pVar1 = p_socket_address_to_native(address,&addr,0x80);
    if (pVar1 != 0) {
      iVar2 = socket->fd;
      pVar4 = p_socket_address_get_native_size(address);
      iVar2 = bind(iVar2,(sockaddr *)&addr,(socklen_t)pVar4);
      if (iVar2 < 0) {
        pVar3 = p_error_get_last_net();
        code = p_error_get_io_from_system(pVar3);
        pVar3 = p_error_get_last_net();
        p_error_set_error_p(error,code,pVar3,"Failed to call bind() on socket");
        return 0;
      }
      return 1;
    }
    message = "Failed to convert socket address to native structure";
    pVar3 = 0x20a;
  }
  p_error_set_error_p(error,pVar3,0,message);
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_bind (const PSocket	*socket,
	       PSocketAddress	*address,
	       pboolean		allow_reuse,
	       PError		**error)
{
	struct sockaddr_storage	addr;

#ifdef SO_REUSEPORT
	pboolean		reuse_port;
#endif

#ifdef P_OS_WIN
	pchar			value;
#else
	pint			value;
#endif

	if (P_UNLIKELY (socket == NULL || address == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	/* Windows allows to reuse the same address even for an active TCP
	 * connection, that's why on Windows we should use SO_REUSEADDR only
	 * for UDP sockets, UNIX doesn't have such behavior
	 *
	 * Ignore errors here, the only likely error is "not supported", and
	 * this is a "best effort" thing mainly */

#ifdef P_OS_WIN
	value = !! (pchar) (allow_reuse && (socket->type == P_SOCKET_TYPE_DATAGRAM));
#else
	value = !! (pint) allow_reuse;
#endif

	if (setsockopt (socket->fd, SOL_SOCKET, SO_REUSEADDR, &value, sizeof (value)) < 0)
		P_WARNING ("PSocket::p_socket_bind: setsockopt() with SO_REUSEADDR failed");

#ifdef SO_REUSEPORT
	reuse_port = allow_reuse && (socket->type == P_SOCKET_TYPE_DATAGRAM);

#  ifdef P_OS_WIN
	value = !! (pchar) reuse_port;
#  else
	value = !! (pint) reuse_port;
#  endif

	if (setsockopt (socket->fd, SOL_SOCKET, SO_REUSEPORT, &value, sizeof (value)) < 0)
		P_WARNING ("PSocket::p_socket_bind: setsockopt() with SO_REUSEPORT failed");
#endif

	if (P_UNLIKELY (p_socket_address_to_native (address, &addr, sizeof (addr)) == FALSE)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to convert socket address to native structure");
		return FALSE;
	}

	if (P_UNLIKELY (bind (socket->fd,
			      (struct sockaddr *) &addr,
			      (socklen_t) p_socket_address_get_native_size (address)) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call bind() on socket");
		return FALSE;
	}

	return TRUE;
}